

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_stat(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *pcVar2;
  CHAR_DATA *pCVar3;
  OBJ_DATA *pOVar4;
  ROOM_INDEX_DATA *pRVar5;
  char *argument_00;
  char arg [4608];
  char local_1228 [4616];
  
  pcVar2 = one_argument(argument,local_1228);
  if (local_1228[0] == '\0') {
    send_to_char("Syntax:\n\r",ch);
    send_to_char("  stat <name>\n\r",ch);
    send_to_char("  stat obj <name>\n\r",ch);
    send_to_char("  stat mob <name>\n\r",ch);
    send_to_char("  stat room <number>\n\r",ch);
    send_to_char("  stat form <name>\n\r",ch);
    pcVar2 = "  stat area\n\r";
LAB_002c5cf5:
    send_to_char(pcVar2,ch);
    return;
  }
  bVar1 = str_cmp(local_1228,"room");
  if (bVar1) {
    argument_00 = "area";
    bVar1 = str_cmp(local_1228,"area");
    if (!bVar1) {
      do_astat(ch,argument_00);
      return;
    }
    bVar1 = str_cmp(local_1228,"obj");
    if (bVar1) {
      bVar1 = str_cmp(local_1228,"char");
      if (((!bVar1) || (bVar1 = str_cmp(local_1228,"mob"), !bVar1)) ||
         (pCVar3 = get_char_world(ch,argument), pcVar2 = argument, pCVar3 != (CHAR_DATA *)0x0)) {
        do_mstat(ch,pcVar2);
        return;
      }
      pOVar4 = get_obj_world(ch,argument);
      if (pOVar4 == (OBJ_DATA *)0x0) {
        pRVar5 = find_location(ch,argument);
        if (pRVar5 == (ROOM_INDEX_DATA *)0x0) {
          pcVar2 = "Nothing by that name found anywhere.\n\r";
          goto LAB_002c5cf5;
        }
        goto LAB_002c5d05;
      }
    }
    do_ostat(ch,pcVar2);
  }
  else {
LAB_002c5d05:
    do_rstat(ch,pcVar2);
  }
  return;
}

Assistant:

void do_stat(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	char *string;
	OBJ_DATA *obj;
	ROOM_INDEX_DATA *location;
	CHAR_DATA *victim;

	string = one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  stat <name>\n\r", ch);
		send_to_char("  stat obj <name>\n\r", ch);
		send_to_char("  stat mob <name>\n\r", ch);
		send_to_char("  stat room <number>\n\r", ch);
		send_to_char("  stat form <name>\n\r", ch);
		send_to_char("  stat area\n\r", ch);
		return;
	}

	if (!str_cmp(arg, "room"))
	{
		do_rstat(ch, string);
		return;
	}

	if (!str_cmp(arg, "area"))
	{
		do_astat(ch, string);
		return;
	}

	if (!str_cmp(arg, "obj"))
	{
		do_ostat(ch, string);
		return;
	}

	if (!str_cmp(arg, "char") || !str_cmp(arg, "mob"))
	{
		do_mstat(ch, string);
		return;
	}

	/* do it the old way */

	victim = get_char_world(ch, argument);

	if (victim != nullptr)
	{
		do_mstat(ch, argument);
		return;
	}

	obj = get_obj_world(ch, argument);

	if (obj != nullptr)
	{
		do_ostat(ch, argument);
		return;
	}

	location = find_location(ch, argument);

	if (location != nullptr)
	{
		do_rstat(ch, argument);
		return;
	}

	send_to_char("Nothing by that name found anywhere.\n\r", ch);
}